

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O1

void __thiscall Utf8Decode_Good_Test::TestBody(Utf8Decode_Good_Test *this)

{
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *__a;
  char *message;
  initializer_list<unsigned_char> __l;
  AssertionResult gtest_ar;
  size_type __dnew;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_70;
  cpstring local_50;
  size_type local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_50._M_dataplus._M_p = (pointer)&DAT_bcce83cf8ccfbace;
  local_50._M_string_length._0_2_ = 0xb5ce;
  __a = &local_70;
  __l._M_len = 10;
  __l._M_array = (iterator)&local_50;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,__l,(allocator_type *)__a);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_50,&local_28,(bytes *)0x1,SUB81(__a,0));
  local_30 = 5;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_30,0);
  local_70.field_2._M_allocated_capacity = local_30;
  builtin_memcpy(local_70._M_dataplus._M_p,L"κόσμε",0x14);
  local_70._M_string_length = local_30;
  local_70._M_dataplus._M_p[local_30] = L'\0';
  testing::internal::CmpHelperEQ<std::__cxx11::u32string,std::__cxx11::u32string>
            (local_80,"decode_good (std::move (test))",
             "cpstring ({0x03BA, 0x03CC, 0x03C3, 0x03BC, 0x03B5})",&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x17d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_50._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F (Utf8Decode, Good) {
    std::vector<std::uint8_t> test{
        0xCE, 0xBA, // GREEK SMALL LETTER KAPPA (U+03BA)
        0xCF, 0x8C, // GREEK SMALL LETTER OMICRON WITH TONOS (U+03CC)
        0xCF, 0x83, // GREEK SMALL LETTER SIGMA (U+03C3)
        0xCE, 0xBC, // GREEK SMALL LETTER MU (U+03BC)
        0xCE, 0xB5, // GREEK SMALL LETTER EPSILON (U+03B5)
    };
    EXPECT_EQ (decode_good (std::move (test)), cpstring ({0x03BA, 0x03CC, 0x03C3, 0x03BC, 0x03B5}));
}